

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_pixmap.cxx
# Opt level: O0

int fl_draw_pixmap(char **cdata,int x,int y,Fl_Color bg)

{
  int iVar1;
  uchar *out;
  int local_60;
  int local_5c;
  int bit;
  int X;
  int Y;
  uchar b;
  uchar *p;
  uchar *bitmap;
  int W;
  uchar *buffer;
  int local_28;
  int h;
  int w;
  Fl_Color bg_local;
  int y_local;
  int x_local;
  char **cdata_local;
  
  h = bg;
  w = y;
  bg_local = x;
  _y_local = cdata;
  iVar1 = fl_measure_pixmap(cdata,&local_28,(int *)((long)&buffer + 4));
  if (iVar1 == 0) {
    cdata_local._4_4_ = 0;
  }
  else {
    out = (uchar *)operator_new__((long)(local_28 * buffer._4_4_ * 4));
    iVar1 = fl_convert_pixmap(_y_local,out,h);
    if (iVar1 == 0) {
      if (out != (uchar *)0x0) {
        operator_delete__(out);
      }
      cdata_local._4_4_ = 0;
    }
    else {
      if (fl_mask_bitmap != (uchar **)0x0) {
        p = (uchar *)operator_new__((long)(((local_28 + 7) / 8) * buffer._4_4_));
        *fl_mask_bitmap = p;
        _Y = out + 3;
        for (bit = 0; bit < buffer._4_4_; bit = bit + 1) {
          X._3_1_ = 0;
          local_60 = 1;
          for (local_5c = 0; local_5c < local_28; local_5c = local_5c + 1) {
            if (0x7f < *_Y) {
              X._3_1_ = X._3_1_ | (byte)local_60;
            }
            local_60 = local_60 << 1;
            if ((0x80 < local_60) || (local_5c == local_28 + -1)) {
              *p = X._3_1_;
              local_60 = 1;
              X._3_1_ = 0;
              p = p + 1;
            }
            _Y = _Y + 4;
          }
        }
      }
      fl_draw_image(out,bg_local,w,local_28,buffer._4_4_,4,0);
      if (out != (uchar *)0x0) {
        operator_delete__(out);
      }
      cdata_local._4_4_ = 1;
    }
  }
  return cdata_local._4_4_;
}

Assistant:

int fl_draw_pixmap(const char*const* cdata, int x, int y, Fl_Color bg) {
  int w, h;

  if (!fl_measure_pixmap(cdata, w, h))
    return 0;

  uchar *buffer = new uchar[w*h*4];

  if (!fl_convert_pixmap(cdata, buffer, bg)) {
    delete[] buffer;
    return 0;
  }

  // FIXME: Hack until fl_draw_image() supports alpha properly
#ifdef  __APPLE_QUARTZ__
  if (Fl_Surface_Device::surface() == Fl_Display_Device::display_device()) {
    Fl_RGB_Image* rgb = new Fl_RGB_Image(buffer, w, h, 4);
    rgb->alloc_array = 1;
    rgb->draw(x, y);
    delete rgb;
    return 1;
  } else {
#endif // __APPLE_QUARTZ__
  // build the mask bitmap used by Fl_Pixmap:
  if (fl_mask_bitmap) {
    int W = (w+7)/8;
    uchar* bitmap = new uchar[W * h];
    *fl_mask_bitmap = bitmap;
    const uchar *p = &buffer[3];
    uchar b = 0;
    for (int Y = 0; Y < h; Y++) {
      b = 0;
      for (int X = 0, bit = 1; X < w; X++, p += 4) {
        if (*p > 127)
          b |= bit;
	    bit <<= 1;
        if (bit > 0x80 || X == w-1) {
	    *bitmap++ = b;
          bit = 1;
	    b = 0;
	  }
      } // if chars_per_pixel
    } // for Y
  }

  fl_draw_image(buffer, x, y, w, h, 4);

#ifdef __APPLE_QUARTZ__
  }
#endif
  delete[] buffer;
  return 1;
}